

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongestEdgeBisection.h
# Opt level: O2

uint32_t leb_EncodeNode(leb_Heap *leb,leb_Node node)

{
  uint32_t uVar1;
  uint32_t uVar2;
  leb_Node node_00;
  
  uVar2 = 0;
  for (; ((ulong)node & 0xfffffffe) != 0;
      node = (leb_Node)
             (((ulong)node & 0xffffffff00000000) - 0x100000000 | (ulong)node >> 1 & 0x7fffffff)) {
    node_00 = (leb_Node)((ulong)node & 0xfffffffffffffffe);
    if (node.id == node.depth) {
      node_00 = node;
    }
    uVar1 = leb__HeapRead(leb,node_00);
    if (((ulong)node & 1) == 0) {
      uVar1 = 0;
    }
    uVar2 = uVar2 + uVar1;
  }
  return uVar2;
}

Assistant:

LEBDEF uint32_t leb_EncodeNode(const leb_Heap *leb, const leb_Node node)
{
    uint32_t nodeID = 0u;
    leb_Node nodeIterator = node;

    while (nodeIterator.id > 1u) {
        leb_Node sibling = leb__LeftSiblingNode(nodeIterator);
        uint32_t nodeCount = leb__HeapRead(leb, {sibling.id, sibling.depth});

        nodeID+= (nodeIterator.id & 1u) * nodeCount;
        nodeIterator = leb__ParentNode_Fast(nodeIterator);
    }

    return nodeID;
}